

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::FourierMotzkinConf::Lhs> __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>_>
::next(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>_>
       *this)

{
  bool bVar1;
  Lhs *data;
  AbstractingUnifier *unifier;
  TermList in_RDI;
  TypedTermList TVar2;
  Renaming normalizer;
  Lhs *ld;
  Renaming *in_stack_ffffffffffffff68;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>_>
  *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar3;
  SortId in_stack_ffffffffffffff90;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>_>
  *in_stack_ffffffffffffffb8;
  QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::FourierMotzkinConf::Lhs> local_10;
  
  do {
    bVar1 = hasLeafData(in_stack_ffffffffffffff70);
    uVar3 = false;
    if (!bVar1) {
      uVar3 = findNextLeaf(in_stack_ffffffffffffffb8);
    }
  } while ((bool)uVar3 != false);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::operator->
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> *)
             0xb4812b);
  data = Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::next
                   ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)0xb48133);
  if ((*(byte *)(in_RDI._content + 0x30) & 1) != 0) {
    Kernel::Renaming::Renaming((Renaming *)in_stack_ffffffffffffff70);
    TVar2 = Kernel::SelectedSummand::key
                      ((SelectedSummand *)CONCAT17(uVar3,in_stack_ffffffffffffff80));
    TVar2._sort = TVar2._sort._content;
    TVar2._sort._content = in_stack_ffffffffffffff90._content;
    TVar2.super_TermList._content = in_RDI._content;
    Kernel::Renaming::normalizeVariables
              ((Renaming *)CONCAT17(uVar3,in_stack_ffffffffffffff80),TVar2);
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>
    ::bdRecord((UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>
                *)TVar2._sort._content,(BacktrackData *)in_stack_ffffffffffffff68);
    *(undefined1 *)(in_RDI._content + 0x90) = 1;
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>
    ::denormalize((UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>
                   *)TVar2._sort._content,in_stack_ffffffffffffff68);
    Kernel::Renaming::~Renaming((Renaming *)0xb481cc);
  }
  unifier = RetrievalAlgorithms::
            UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>
            ::unifier((UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>
                       *)0xb481f2);
  QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::FourierMotzkinConf::Lhs>::QueryRes
            (&local_10,unifier,data);
  return local_10;
}

Assistant:

QueryRes<Unifier, LeafData> next()
      {
        while(!hasLeafData() && findNextLeaf()) {}
        ASS(hasLeafData());

        ASS(!_normalizationRecording);

        auto ld = _leafData->next();
        if (_retrieveSubstitution) {
            Renaming normalizer;
            normalizer.normalizeVariables(ld->key());

            ASS(_normalizationBacktrackData.isEmpty());
            _algo.bdRecord(_normalizationBacktrackData);
            _normalizationRecording=true;

            _algo.denormalize(normalizer);
        }

        DEBUG_QUERY(1, "leaf data: ", *ld)
        return QueryRes(_algo.unifier(), ld);
      }